

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void DoAccept<true>::Do(ResxData *data,cmSourceFile *f)

{
  string *psVar1;
  cmSourceFile *f_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string hFileName;
  string resx;
  
  f_local = f;
  psVar1 = cmSourceFile::GetFullPath(f,(string *)0x0);
  std::__cxx11::string::string((string *)&resx,(string *)psVar1);
  std::__cxx11::string::find_last_of((char *)&resx,0x46a2b5);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&resx);
  std::operator+(&hFileName,&local_70,".h");
  std::__cxx11::string::~string((string *)&local_70);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)data,&hFileName);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::push_back
            (&data->ResxSources,&f_local);
  std::__cxx11::string::~string((string *)&hFileName);
  std::__cxx11::string::~string((string *)&resx);
  return;
}

Assistant:

static void Do(cmGeneratorTarget::ResxData& data, cmSourceFile* f)
    {
    // Build and save the name of the corresponding .h file
    // This relationship will be used later when building the project files.
    // Both names would have been auto generated from Visual Studio
    // where the user supplied the file name and Visual Studio
    // appended the suffix.
    std::string resx = f->GetFullPath();
    std::string hFileName = resx.substr(0, resx.find_last_of(".")) + ".h";
    data.ExpectedResxHeaders.insert(hFileName);
    data.ResxSources.push_back(f);
    }